

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O0

btVector3 __thiscall btBox2dShape::localGetSupportingVertex(btBox2dShape *this,btVector3 *vec)

{
  btScalar bVar1;
  btScalar bVar2;
  btVector3 *pbVar3;
  btScalar *pbVar4;
  btVector3 *in_RSI;
  btBox2dShape *in_RDI;
  btVector3 margin;
  btVector3 halfExtents;
  btScalar local_60;
  btScalar local_5c;
  btScalar local_58;
  btScalar local_54;
  btScalar local_50;
  btScalar local_4c;
  btVector3 local_48;
  btVector3 local_38;
  btVector3 *local_20;
  btVector3 local_10;
  
  local_20 = in_RSI;
  pbVar3 = getHalfExtentsWithoutMargin(in_RDI);
  local_38.m_floats[0] = pbVar3->m_floats[0];
  local_38.m_floats[1] = pbVar3->m_floats[1];
  local_38.m_floats[2] = pbVar3->m_floats[2];
  local_38.m_floats[3] = pbVar3->m_floats[3];
  (*(in_RDI->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(in_RDI->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(in_RDI->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  btVector3::btVector3(&local_48,&local_4c,&local_50,&local_54);
  btVector3::operator+=(&local_38,&local_48);
  pbVar4 = btVector3::x(local_20);
  bVar1 = *pbVar4;
  pbVar4 = btVector3::x(&local_38);
  bVar2 = *pbVar4;
  pbVar4 = btVector3::x(&local_38);
  local_58 = btFsel(bVar1,bVar2,-*pbVar4);
  pbVar4 = btVector3::y(local_20);
  bVar1 = *pbVar4;
  pbVar4 = btVector3::y(&local_38);
  bVar2 = *pbVar4;
  pbVar4 = btVector3::y(&local_38);
  local_5c = btFsel(bVar1,bVar2,-*pbVar4);
  pbVar4 = btVector3::z(local_20);
  bVar1 = *pbVar4;
  pbVar4 = btVector3::z(&local_38);
  bVar2 = *pbVar4;
  pbVar4 = btVector3::z(&local_38);
  local_60 = btFsel(bVar1,bVar2,-*pbVar4);
  btVector3::btVector3(&local_10,&local_58,&local_5c,&local_60);
  return (btVector3)local_10.m_floats;
}

Assistant:

virtual btVector3	localGetSupportingVertex(const btVector3& vec) const
	{
		btVector3 halfExtents = getHalfExtentsWithoutMargin();
		btVector3 margin(getMargin(),getMargin(),getMargin());
		halfExtents += margin;
		
		return btVector3(btFsels(vec.x(), halfExtents.x(), -halfExtents.x()),
			btFsels(vec.y(), halfExtents.y(), -halfExtents.y()),
			btFsels(vec.z(), halfExtents.z(), -halfExtents.z()));
	}